

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_KDReportsTableBreakingSettingsDialog.cpp
# Opt level: O1

int __thiscall
KDReports::TableBreakingSettingsDialog::qt_metacall
          (TableBreakingSettingsDialog *this,Call _c,int _id,void **_a)

{
  int iVar1;
  long lVar2;
  undefined4 in_register_00000014;
  
  iVar1 = QDialog::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (iVar1 < 0) {
    return iVar1;
  }
  if (_c == RegisterMethodArgumentMetaType) {
    if (iVar1 < 2) {
      *(undefined8 *)*_a = 0;
    }
  }
  else {
    if (_c != InvokeMetaMethod) {
      return iVar1;
    }
    if (iVar1 < 2) {
      if (iVar1 == 0) {
        lVar2 = 0x1b8;
      }
      else {
        if (iVar1 != 1) goto LAB_00128b25;
        lVar2 = 0x1c0;
      }
      (**(code **)(*(long *)this + lVar2))(this);
    }
  }
LAB_00128b25:
  return iVar1 + -2;
}

Assistant:

int KDReports::TableBreakingSettingsDialog::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QDialog::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 2)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 2;
    }
    return _id;
}